

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

boolean lookup_id_mapping(uint gid,uint *nidp)

{
  bucket *local_28;
  bucket *curr;
  int i;
  uint *nidp_local;
  uint gid_local;
  
  if (n_ids_mapped != 0) {
    for (local_28 = id_map; local_28 != (bucket *)0x0; local_28 = local_28->next) {
      if (local_28 == id_map) {
        curr._4_4_ = n_ids_mapped % 0x40;
        if (curr._4_4_ == 0) {
          curr._4_4_ = 0x40;
        }
      }
      else {
        curr._4_4_ = 0x40;
      }
      while (curr._4_4_ = curr._4_4_ + -1, -1 < curr._4_4_) {
        if (gid == local_28->map[curr._4_4_].gid) {
          *nidp = local_28->map[curr._4_4_].nid;
          return '\x01';
        }
      }
    }
  }
  return '\0';
}

Assistant:

boolean lookup_id_mapping(unsigned gid, unsigned *nidp)
{
    int i;
    struct bucket *curr;

    if (n_ids_mapped)
	for (curr = id_map; curr; curr = curr->next) {
	    /* first bucket might not be totally full */
	    if (curr == id_map) {
		i = n_ids_mapped % N_PER_BUCKET;
		if (i == 0) i = N_PER_BUCKET;
	    } else
		i = N_PER_BUCKET;

	    while (--i >= 0)
		if (gid == curr->map[i].gid) {
		    *nidp = curr->map[i].nid;
		    return TRUE;
		}
	}

    return FALSE;
}